

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

const_iterator __thiscall
duckdb::ModeState<long,_duckdb::ModeStandard<long>_>::Scan
          (ModeState<long,_duckdb::ModeStandard<long>_> *this)

{
  ulong uVar1;
  ulong uVar2;
  _Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false> _Var3;
  _Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false> _Var4;
  
  _Var3._M_cur = (__node_type *)(this->frequency_map->_M_h)._M_before_begin._M_nxt;
  _Var4._M_cur = _Var3._M_cur;
  if (_Var3._M_cur == (__node_type *)0x0) {
    return (const_iterator)(__node_type *)0x0;
  }
  do {
    uVar1 = *(ulong *)((long)&((_Var3._M_cur)->
                              super__Hash_node_value<std::pair<const_long,_duckdb::ModeAttr>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_long,_duckdb::ModeAttr>_>.
                              _M_storage._M_storage + 8);
    uVar2 = *(ulong *)((long)&((_Var4._M_cur)->
                              super__Hash_node_value<std::pair<const_long,_duckdb::ModeAttr>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_long,_duckdb::ModeAttr>_>.
                              _M_storage._M_storage + 8);
    if ((uVar1 < uVar2) ||
       ((uVar2 == uVar1 &&
        (*(ulong *)((long)&((_Var4._M_cur)->
                           super__Hash_node_value<std::pair<const_long,_duckdb::ModeAttr>,_false>).
                           super__Hash_node_value_base<std::pair<const_long,_duckdb::ModeAttr>_>.
                           _M_storage._M_storage + 0x10) <
         *(ulong *)((long)&((_Var3._M_cur)->
                           super__Hash_node_value<std::pair<const_long,_duckdb::ModeAttr>,_false>).
                           super__Hash_node_value_base<std::pair<const_long,_duckdb::ModeAttr>_>.
                           _M_storage._M_storage + 0x10))))) {
      _Var3._M_cur = _Var4._M_cur;
    }
    _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
  } while (_Var4._M_cur != (__node_type *)0x0);
  return (const_iterator)_Var3._M_cur;
}

Assistant:

typename Counts::const_iterator Scan() const {
		//! Initialize control variables to first variable of the frequency map
		auto highest_frequency = frequency_map->begin();
		for (auto i = highest_frequency; i != frequency_map->end(); ++i) {
			// Tie break with the lowest insert position
			if (i->second.count > highest_frequency->second.count ||
			    (i->second.count == highest_frequency->second.count &&
			     i->second.first_row < highest_frequency->second.first_row)) {
				highest_frequency = i;
			}
		}
		return highest_frequency;
	}